

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

float trng::math::detail::inv_Beta_I<float>(float x,float p,float q,float norm)

{
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Db;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar5 [16];
  
  fVar8 = 0.0;
  if (1.1920929e-07 <= x) {
    fVar8 = 1.0;
    if (1.1920929e-07 <= 1.0 - x) {
      if ((p + p < 1.0) || (q + q < 1.0)) {
        fVar8 = logf(p / (p + q));
        fVar2 = logf(q / (p + q));
        fVar8 = expf(fVar8 * p);
        fVar2 = expf(fVar2 * q);
        auVar6._4_4_ = extraout_XMM0_Db;
        auVar6._0_4_ = fVar8;
        auVar6._8_4_ = extraout_XMM0_Db;
        auVar6._12_4_ = extraout_XMM0_Db_00;
        auVar5._8_8_ = auVar6._8_8_;
        auVar5._4_4_ = fVar2;
        auVar5._0_4_ = fVar8;
        auVar7._4_4_ = q;
        auVar7._0_4_ = p;
        auVar7._8_4_ = in_XMM1_Db;
        auVar7._12_4_ = in_XMM2_Db;
        auVar7 = divps(auVar5,auVar7);
        fVar8 = auVar7._4_4_ + auVar7._0_4_;
        if (auVar7._0_4_ / fVar8 <= x) {
          fVar8 = powf((1.0 - x) * fVar8 * q,1.0 / q);
          fVar8 = 1.0 - fVar8;
        }
        else {
          fVar8 = powf(fVar8 * p * x,1.0 / p);
        }
      }
      else {
        fVar8 = (p * 3.0 + -1.0) / (q * 3.0 + p * 3.0 + -2.0);
      }
      for (iVar1 = 0; iVar1 != 0x18; iVar1 = iVar1 + 1) {
        fVar2 = Beta_I<float>(fVar8,p,q,norm);
        fVar3 = powf(1.0 - fVar8,q + -1.0);
        fVar4 = powf(fVar8,p + -1.0);
        if (ABS((fVar2 - x) / fVar8) < 2.3841858e-07) {
          return fVar8;
        }
        for (fVar2 = (fVar2 - x) / ((fVar3 * fVar4) / norm);
            (fVar3 = fVar8 - fVar2, fVar3 <= 0.0 || (1.0 <= fVar3)); fVar2 = fVar2 * 0.75) {
        }
        fVar8 = fVar3;
      }
    }
  }
  return fVar8;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Beta_I(T x, T p, T q, T norm) {
        if (x < numeric_limits<T>::epsilon())
          return 0;
        if (1 - x < numeric_limits<T>::epsilon())
          return 1;
        // solve via Newton method
        T y{0};
        if (2 * p >= 1 and 2 * q >= 1)
          y = (3 * p - 1) / (3 * p + 3 * q - 2);  // the approximate median
        else {
          // following initial guess given in "Numerical Recipes" by W. H. Press et al., 3rd
          // edition
          const T lnp{ln(p / (p + q))};
          const T lnq{ln(q / (p + q))};
          const T t{exp(p * lnp) / p};
          const T u{exp(q * lnq) / q};
          const T w{t + u};
          if (x < t / w)
            y = pow(p * w * x, 1 / p);
          else
            y = 1 - pow(q * w * (1 - x), 1 / q);
        }
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          const T f{Beta_I(y, p, q, norm) - x};
          const T df{pow(1 - y, q - 1) * pow(y, p - 1) / norm};
          T dy(f / df);
          if (abs(f / y) < 2 * numeric_limits<T>::epsilon())
            break;
          // avoid overshooting
          while (y - dy <= 0 or y - dy >= 1)
            dy *= T{3} / T{4};
          y -= dy;
        }
        return y;
      }